

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  dynbuf *s;
  bool bVar1;
  CURLcode CVar2;
  _Bool _Var3;
  CURLcode CVar4;
  size_t sVar5;
  uint *puVar6;
  char *ptr;
  void *pvVar7;
  int iVar8;
  ulong size_00;
  ssize_t gotbytes;
  char buffer [900];
  CURLcode local_3e4;
  size_t local_3d8;
  size_t *local_3d0;
  connectdata *local_3c8;
  int *local_3c0;
  char local_3b8 [904];
  
  local_3c8 = data->conn;
  *code = 0;
  *size = 0;
  local_3d0 = size;
  local_3c0 = code;
  if (pp->nfinal != 0) {
    sVar5 = Curl_dyn_len(&pp->recvbuf);
    Curl_dyn_tail(&pp->recvbuf,sVar5 - pp->nfinal);
    pp->nfinal = 0;
  }
  if (pp->overflow == 0) {
    local_3d8 = 0;
    sockfd = Curl_read(data,sockfd,local_3b8,900,(ssize_t *)&local_3d8);
    if (sockfd == CURLE_OK) {
      if ((long)local_3d8 < 1) {
        puVar6 = (uint *)__errno_location();
        bVar1 = false;
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar6);
        sockfd = CURLE_RECV_ERROR;
        CVar4 = CURLE_OK;
      }
      else {
        sockfd = Curl_dyn_addn(&pp->recvbuf,local_3b8,local_3d8);
        CVar4 = CURLE_OK;
        if (sockfd == CURLE_OK) {
          puVar6 = &(data->req).headerbytecount;
          *puVar6 = *puVar6 + (int)local_3d8;
          pp->nread_resp = pp->nread_resp + local_3d8;
          bVar1 = true;
        }
        else {
          bVar1 = false;
          CVar4 = sockfd;
        }
      }
    }
    else {
      bVar1 = false;
      CVar4 = sockfd;
      if (sockfd == CURLE_AGAIN) {
        sockfd = CURLE_OK;
      }
      else {
        bVar1 = false;
      }
    }
    if (!bVar1) {
      return sockfd;
    }
  }
  else {
    CVar4 = CURLE_OK;
  }
  s = &pp->recvbuf;
  local_3e4 = sockfd;
  do {
    ptr = Curl_dyn_ptr(s);
    sVar5 = Curl_dyn_len(s);
    pvVar7 = memchr(ptr,10,sVar5);
    if (pvVar7 == (void *)0x0) {
      pp->overflow = 0;
LAB_006434a3:
      iVar8 = 2;
      CVar2 = local_3e4;
    }
    else {
      size_00 = (long)pvVar7 + (1 - (long)ptr);
      iVar8 = 1;
      Curl_debug(data,CURLINFO_HEADER_IN,ptr,size_00);
      CVar4 = Curl_client_write(data,2,ptr,size_00);
      CVar2 = CVar4;
      if (CVar4 == CURLE_OK) {
        _Var3 = (*pp->endofresp)(data,local_3c8,ptr,size_00,local_3c0);
        if (_Var3) {
          pp->nfinal = size_00;
          sVar5 = Curl_dyn_len(s);
          if (size_00 < sVar5) {
            sVar5 = Curl_dyn_len(s);
            sVar5 = sVar5 - size_00;
          }
          else {
            sVar5 = 0;
          }
          pp->overflow = sVar5;
          *local_3d0 = pp->nread_resp;
          pp->nread_resp = 0;
          goto LAB_006434a3;
        }
        sVar5 = Curl_dyn_len(s);
        if (size_00 < sVar5) {
          sVar5 = Curl_dyn_len(s);
          Curl_dyn_tail(s,sVar5 - size_00);
        }
        else {
          Curl_dyn_reset(s);
        }
        iVar8 = 0;
        CVar2 = local_3e4;
      }
    }
    local_3e4 = CVar2;
    if (iVar8 != 0) {
      if (iVar8 == 2) {
        pp->pending_resp = false;
        local_3e4 = CVar4;
      }
      return local_3e4;
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  if(pp->nfinal) {
    /* a previous call left this many bytes in the beginning of the buffer as
       that was the final line; now ditch that */
    size_t full = Curl_dyn_len(&pp->recvbuf);

    /* trim off the "final" leading part */
    Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

    pp->nfinal = 0; /* now gone */
  }
  if(!pp->overflow) {
    ssize_t gotbytes = 0;
    char buffer[900];

    result = pingpong_read(data, sockfd, buffer, sizeof(buffer), &gotbytes);
    if(result == CURLE_AGAIN)
      return CURLE_OK;

    if(result)
      return result;

    if(gotbytes <= 0) {
      failf(data, "response reading failed (errno: %d)", SOCKERRNO);
      return CURLE_RECV_ERROR;
    }

    result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
    if(result)
      return result;

    data->req.headerbytecount += (unsigned int)gotbytes;

    pp->nread_resp += gotbytes;
  }

  do {
    char *line = Curl_dyn_ptr(&pp->recvbuf);
    char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
    if(nl) {
      /* a newline is CRLF in pp-talk, so the CR is ignored as
         the line isn't really terminated until the LF comes */
      size_t length = nl - line + 1;

      /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
      if(!conn->sec_complete)
#endif
        Curl_debug(data, CURLINFO_HEADER_IN, line, length);

      /*
       * Pass all response-lines to the callback function registered for
       * "headers". The response lines can be seen as a kind of headers.
       */
      result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
      if(result)
        return result;

      if(pp->endofresp(data, conn, line, length, code)) {
        /* When at "end of response", keep the endofresp line first in the
           buffer since it will be accessed outside (by pingpong
           parsers). Store the overflow counter to inform about additional
           data in this buffer after the endofresp line. */
        pp->nfinal = length;
        if(Curl_dyn_len(&pp->recvbuf) > length)
          pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
        else
          pp->overflow = 0;
        *size = pp->nread_resp; /* size of the response */
        pp->nread_resp = 0; /* restart */
        break;
      }
      if(Curl_dyn_len(&pp->recvbuf) > length)
        /* keep the remaining piece */
        Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
      else
        Curl_dyn_reset(&pp->recvbuf);
    }
    else {
      /* without a newline, there is no overflow */
      pp->overflow = 0;
      break;
    }

  } while(1); /* while there's buffer left to scan */

  pp->pending_resp = FALSE;

  return result;
}